

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O1

int __thiscall QtConcurrent::ThreadEngineBarrier::release(ThreadEngineBarrier *this)

{
  uint uVar1;
  uint in_ECX;
  bool bVar2;
  
  do {
    uVar1 = (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    if (uVar1 == 0xffffffff) {
      LOCK();
      bVar2 = (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == -1;
      if (bVar2) {
        (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = 0;
      }
      UNLOCK();
      if (!bVar2) goto code_r0x0010296c;
      QSemaphore::release((int)this + 8);
      in_ECX = 0;
      bVar2 = false;
    }
    else if ((int)uVar1 < 0) {
      LOCK();
      bVar2 = uVar1 == (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int>._M_i;
      if (bVar2) {
        (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = uVar1 + 1;
      }
      UNLOCK();
      if (!bVar2) goto code_r0x0010296c;
      in_ECX = ~uVar1;
      bVar2 = false;
    }
    else {
      LOCK();
      bVar2 = uVar1 == (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int>._M_i;
      if (bVar2) {
        (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = uVar1 - 1;
      }
      UNLOCK();
      if (bVar2) {
        bVar2 = false;
        in_ECX = uVar1 - 1;
      }
      else {
code_r0x0010296c:
        bVar2 = true;
      }
    }
    if (!bVar2) {
      return in_ECX;
    }
  } while( true );
}

Assistant:

int ThreadEngineBarrier::release()
{
    forever {
        int localCount = count.loadRelaxed();
        if (localCount == -1) {
            if (count.testAndSetOrdered(-1, 0)) {
                semaphore.release();
                return 0;
            }
        } else if (localCount < 0) {
            if (count.testAndSetOrdered(localCount, localCount + 1))
                return qAbs(localCount + 1);
        } else {
            if (count.testAndSetOrdered(localCount, localCount - 1))
                return localCount - 1;
        }
        qYieldCpu();
    }